

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_stwat(DisasContext_conflict10 *ctx)

{
  gen_st_atomic(ctx,ctx->default_tcg_memop_mask | MO_32);
  return;
}

Assistant:

static void gen_stwat(DisasContext *ctx)
{
    gen_st_atomic(ctx, DEF_MEMOP(MO_UL));
}